

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_buffer.h
# Opt level: O2

iterator __thiscall
r_code::time_buffer<r_exec::CInput,_r_exec::CInput::IsInvalidated>::erase
          (time_buffer<r_exec::CInput,_r_exec::CInput::IsInvalidated> *this,iterator *i)

{
  uintptr_t uVar1;
  iterator iVar2;
  
  uVar1 = list<r_exec::CInput>::_erase(&this->super_list<r_exec::CInput>,i->_cell);
  iVar2._cell = uVar1;
  iVar2.buffer = this;
  return iVar2;
}

Assistant:

iterator erase(iterator &i)
    {
        return iterator(this, this->_erase(i._cell));
    }